

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<unsigned_long_long,long_long,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,unsigned_long_long *v,
               unsigned_long_long v_min,unsigned_long_long v_max,char *format,float power,
               ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  unsigned_long_long uVar5;
  unsigned_long_long *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  unsigned_long_long in_R8;
  ulong in_R9;
  float in_XMM0_Da;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  double dVar12;
  ImVec2 IVar13;
  uint in_stack_00000010;
  undefined8 *in_stack_00000018;
  float grab_pos;
  float grab_t;
  unsigned_long_long v_new_off_round;
  unsigned_long_long v_new_off_floor;
  double v_new_off_f;
  float a_1;
  float a;
  unsigned_long_long v_new;
  int decimal_precision;
  float delta;
  ImVec2 delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  double linear_dist_max_to_0;
  double linear_dist_min_to_0;
  float linear_zero_pos;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  longlong v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_power;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  float in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed4;
  float in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffedc;
  float in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  float local_104;
  long lVar14;
  undefined3 in_stack_ffffffffffffff0c;
  uint3 uVar15;
  uint uVar16;
  undefined1 uVar17;
  undefined8 local_f0;
  unsigned_long_long in_stack_ffffffffffffff18;
  undefined4 local_e0;
  ImGuiDataType in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  float local_cc;
  ulong in_stack_ffffffffffffff40;
  double in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  unsigned_long_long in_stack_ffffffffffffff58;
  ImGuiDataType in_stack_ffffffffffffff60;
  float local_98;
  float local_94;
  float fStack_90;
  float local_88;
  bool local_81;
  float local_70;
  float local_54;
  ImGuiNavDirSourceFlags dir_sources;
  
  pIVar1 = GImGui;
  uVar3 = (uint)((in_stack_00000010 & 1) != 0);
  uVar16 = CONCAT13(1,in_stack_ffffffffffffff0c);
  if (in_EDX != 4) {
    uVar16 = CONCAT13(in_EDX == 5,in_stack_ffffffffffffff0c);
  }
  uVar17 = (undefined1)(uVar16 >> 0x18);
  uVar15 = (uint3)(ushort)uVar16;
  if ((in_XMM0_Da != 1.0) || (NAN(in_XMM0_Da))) {
    uVar15 = CONCAT12(uVar17,(ushort)uVar16);
  }
  dir_sources = CONCAT13(uVar17,uVar15);
  fVar6 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  fVar7 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  fVar7 = (fVar6 - fVar7) - 4.0;
  local_54 = (pIVar1->Style).GrabMinSize;
  if (in_R8 < in_R9) {
    lVar4 = in_R9 - in_R8;
  }
  else {
    lVar4 = in_R8 - in_R9;
  }
  local_94 = in_stack_fffffffffffffed8;
  lVar14 = lVar4;
  if (((uVar16 & 0x1000000) == 0) && (-1 < lVar4)) {
    local_54 = ImMax<float>(fVar7 / (float)(lVar4 + 1),(pIVar1->Style).GrabMinSize);
    local_94 = in_stack_fffffffffffffed8;
  }
  fVar8 = ImMin<float>(local_54,fVar7);
  fVar9 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  fVar9 = fVar8 * 0.5 + fVar9 + 2.0;
  fVar10 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  if (((uVar15 & 0x10000) == 0) || (local_104 = (float)(in_R8 * in_R9), 0.0 <= local_104)) {
    in_stack_fffffffffffffee0 = (float)(long)in_R8;
    in_stack_fffffffffffffee4 = (float)in_R8;
    local_70 = (float)(-(uint)(in_stack_fffffffffffffee4 < 0.0) & 0x3f800000);
  }
  else {
    dVar11 = ImPow((double)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (double)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    dVar12 = ImPow((double)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (double)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_70 = (float)(dVar11 / (dVar11 + dVar12));
  }
  local_81 = false;
  if (pIVar1->ActiveId == in_ESI) {
    bVar2 = false;
    local_88 = 0.0;
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar1->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        fVar6 = ImVec2::operator[](&(pIVar1->IO).MousePos,(long)(int)uVar3);
        if (fVar7 - fVar8 <= 0.0) {
          in_stack_fffffffffffffedc = 0.0;
        }
        else {
          in_stack_fffffffffffffedc = ImClamp<float>((fVar6 - fVar9) / (fVar7 - fVar8),0.0,1.0);
        }
        local_88 = in_stack_fffffffffffffedc;
        if (uVar3 == 1) {
          local_88 = 1.0 - in_stack_fffffffffffffedc;
        }
        bVar2 = true;
      }
    }
    else if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar13 = GetNavInputAmount2d(dir_sources,(ImGuiInputReadMode)fVar6,
                                   (float)((ulong)lVar14 >> 0x20),(float)lVar14);
      if (uVar3 == 0) {
        local_94 = IVar13.x;
      }
      else {
        fStack_90 = IVar13.y;
        local_94 = -fStack_90;
      }
      if ((pIVar1->NavActivatePressedId == in_ESI) && ((pIVar1->ActiveIdIsJustActivated & 1U) == 0))
      {
        ClearActiveID();
      }
      else if ((local_94 != 0.0) || (NAN(local_94))) {
        fVar6 = local_94;
        local_88 = SliderCalcRatioFromValueT<unsigned_long_long,double>
                             (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              (unsigned_long_long)in_stack_ffffffffffffff48,
                              (float)(in_stack_ffffffffffffff40 >> 0x20),
                              (float)in_stack_ffffffffffffff40);
        if ((uVar16 & 0x1000000) == 0) {
          in_stack_fffffffffffffed4 = 0.0;
        }
        else {
          in_stack_fffffffffffffed4 =
               (float)ImParseFormatPrecision
                                ((char *)CONCAT44(in_stack_fffffffffffffedc,fVar6),
                                 (int)in_stack_fffffffffffffed4);
        }
        if (((int)in_stack_fffffffffffffed4 < 1) && ((uVar15 & 0x10000) == 0)) {
          if (((-100.0 <= (float)lVar4) && ((float)lVar4 <= 100.0)) ||
             (bVar2 = IsNavInputDown(0xe), bVar2)) {
            local_98 = (float)(~-(uint)(local_94 < 0.0) & 0x3f800000 |
                              -(uint)(local_94 < 0.0) & 0xbf800000) / (float)lVar4;
          }
          else {
            local_98 = local_94 / 100.0;
          }
        }
        else {
          local_98 = local_94 / 100.0;
          bVar2 = IsNavInputDown(0xe);
          if (bVar2) {
            local_98 = local_98 / 10.0;
          }
        }
        bVar2 = IsNavInputDown(0xf);
        if (bVar2) {
          local_98 = local_98 * 10.0;
        }
        bVar2 = true;
        if (((1.0 <= local_88) && (0.0 < local_98)) || ((local_88 <= 0.0 && (local_98 < 0.0)))) {
          bVar2 = false;
          local_94 = fVar6;
        }
        else {
          local_88 = ImSaturate(local_88 + local_98);
          local_94 = fVar6;
        }
      }
    }
    if (bVar2) {
      if ((uVar15 & 0x10000) == 0) {
        if ((uVar16 & 0x1000000) == 0) {
          in_stack_fffffffffffffed0 = (float)(in_R9 - in_R8);
          in_stack_ffffffffffffff48 = (double)(in_stack_fffffffffffffed0 * local_88);
          in_stack_ffffffffffffff40 = (ulong)(in_stack_fffffffffffffed0 * local_88);
          in_stack_ffffffffffffff40 =
               in_stack_ffffffffffffff40 |
               (long)(in_stack_ffffffffffffff48 - 9.223372036854776e+18) &
               (long)in_stack_ffffffffffffff40 >> 0x3f;
        }
        else {
          ImLerp<unsigned_long_long>(in_R8,in_R9,local_88);
        }
      }
      else if (local_70 <= local_88) {
        ImFabs(local_70 - 1.0);
        in_stack_ffffffffffffff50 = ImPow(0.0,2.392168e-39);
        uVar5 = ImMax<unsigned_long_long>(in_R8,0);
        ImLerp<unsigned_long_long>(uVar5,in_R9,in_stack_ffffffffffffff50);
      }
      else {
        in_stack_ffffffffffffff54 = ImPow(0.0,2.391896e-39);
        uVar5 = ImMin<unsigned_long_long>(in_R9,0);
        ImLerp<unsigned_long_long>(uVar5,in_R8,in_stack_ffffffffffffff54);
      }
      in_stack_ffffffffffffff58 =
           RoundScalarWithFormatT<unsigned_long_long,long_long>
                     (in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff18)
      ;
      local_81 = *in_RCX != in_stack_ffffffffffffff58;
      if (local_81) {
        *in_RCX = in_stack_ffffffffffffff58;
      }
    }
  }
  local_cc = SliderCalcRatioFromValueT<unsigned_long_long,double>
                       (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        (unsigned_long_long)in_stack_ffffffffffffff48,
                        (float)(in_stack_ffffffffffffff40 >> 0x20),(float)in_stack_ffffffffffffff40)
  ;
  if (uVar3 == 1) {
    local_cc = 1.0 - local_cc;
  }
  ImLerp<float>(fVar9,-fVar8 * 0.5 + (fVar10 - 2.0),local_cc);
  if (uVar3 == 0) {
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   in_stack_fffffffffffffedc,local_94,in_stack_fffffffffffffed4,
                   in_stack_fffffffffffffed0);
    *in_stack_00000018 = CONCAT44(in_stack_ffffffffffffff24,local_e0);
    in_stack_00000018[1] = in_stack_ffffffffffffff28;
  }
  else {
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   in_stack_fffffffffffffedc,local_94,in_stack_fffffffffffffed4,
                   in_stack_fffffffffffffed0);
    *in_stack_00000018 = local_f0;
    in_stack_00000018[1] = in_stack_ffffffffffffff18;
  }
  return local_81;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz*0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz*0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f/power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f/power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (!is_decimal && v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    // Output grab position so it can be displayed by the caller
    float grab_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
    if (axis == ImGuiAxis_Y)
        grab_t = 1.0f - grab_t;
    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
    if (axis == ImGuiAxis_X)
        *out_grab_bb = ImRect(grab_pos - grab_sz*0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz*0.5f, bb.Max.y - grab_padding);
    else
        *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz*0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz*0.5f);

    return value_changed;
}